

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

FileName * __thiscall
embree::FileName::operator-(FileName *__return_storage_ptr__,FileName *this,FileName *base)

{
  long lVar1;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)base);
  lVar1 = std::__cxx11::string::find_first_of((string *)this,(ulong)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
    FileName(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::operator -( const FileName& base ) const {
    size_t pos = filename.find_first_of(base);
    if (pos == std::string::npos) return *this;
    return FileName(filename.substr(pos+1));
  }